

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_api.c
# Opt level: O2

void constraints_compiles(void)

{
  undefined8 uVar1;
  char array [5];
  
  uVar1 = create_equal_to_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x1b,"1",1,uVar1);
  uVar1 = create_not_equal_to_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x1c,"1",1,uVar1);
  uVar1 = create_greater_than_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x1d,"1",1,uVar1);
  uVar1 = create_less_than_value_constraint(1,"1");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x1e,"1",1,uVar1);
  uVar1 = create_equal_to_contents_constraint(array,5,"array");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x20,"array",array,uVar1);
  uVar1 = create_not_equal_to_contents_constraint(array,3,"array");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x21,"array",array,uVar1);
  uVar1 = create_equal_to_string_constraint("some string","string");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x23,"string","some string",uVar1);
  uVar1 = create_not_equal_to_string_constraint("some string","string");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x24,"string","some string",uVar1);
  uVar1 = create_contains_string_constraint("some string","string");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x25,"string","some string",uVar1);
  uVar1 = create_does_not_contain_string_constraint("some string","string");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x26,"string","some string",uVar1);
  uVar1 = create_begins_with_string_constraint("some string","string");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x27,"string","some string",uVar1);
  return;
}

Assistant:

Ensure(constraints_compiles) {
    char array[5];
    char *string = (char *)"some string";

    assert_that(1, is_equal_to(1));
    assert_that(1, is_not_equal_to(1));
    assert_that(1, is_greater_than(1));
    assert_that(1, is_less_than(1));

    assert_that(array, is_equal_to_contents_of(array, 5));
    assert_that(array, is_not_equal_to_contents_of(array, 3));

    assert_that(string, is_equal_to_string(string));
    assert_that(string, is_not_equal_to_string(string));
    assert_that(string, contains_string(string));
    assert_that(string, does_not_contain_string(string));
    assert_that(string, begins_with_string(string));
}